

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_CCtx_refPrefix_advanced
                 (ZSTD_CCtx *cctx,void *prefix,size_t prefixSize,
                 ZSTD_dictContentType_e dictContentType)

{
  if (cctx->streamStage != zcss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_clearAllDicts(cctx);
  if (prefixSize != 0 && prefix != (void *)0x0) {
    (cctx->prefixDict).dict = prefix;
    (cctx->prefixDict).dictSize = prefixSize;
    (cctx->prefixDict).dictContentType = dictContentType;
  }
  return 0;
}

Assistant:

size_t ZSTD_CCtx_refPrefix_advanced(
        ZSTD_CCtx* cctx, const void* prefix, size_t prefixSize, ZSTD_dictContentType_e dictContentType)
{
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                    "Can't ref a prefix when ctx not in init stage.");
    ZSTD_clearAllDicts(cctx);
    if (prefix != NULL && prefixSize > 0) {
        cctx->prefixDict.dict = prefix;
        cctx->prefixDict.dictSize = prefixSize;
        cctx->prefixDict.dictContentType = dictContentType;
    }
    return 0;
}